

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall inja::Parser::parse_into_template(Parser *this,Template *tmpl,path *filename)

{
  ParserConfig *parser_config;
  LexerConfig *lexer_config;
  path local_1d8;
  undefined1 local_1b0 [8];
  Parser sub_parser;
  path *filename_local;
  Template *tmpl_local;
  Parser *this_local;
  
  parser_config = this->config;
  sub_parser.block_statement_stack.c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)filename;
  lexer_config = Lexer::get_config(&this->lexer);
  Parser((Parser *)local_1b0,parser_config,lexer_config,this->template_storage,
         this->function_storage);
  ::std::filesystem::__cxx11::path::parent_path();
  parse_into((Parser *)local_1b0,tmpl,&local_1d8);
  std::filesystem::__cxx11::path::~path(&local_1d8);
  ~Parser((Parser *)local_1b0);
  return;
}

Assistant:

void parse_into_template(Template& tmpl, std::filesystem::path filename) {
    auto sub_parser = Parser(config, lexer.get_config(), template_storage, function_storage);
    sub_parser.parse_into(tmpl, filename.parent_path());
  }